

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_put.c
# Opt level: O0

int buffer_put(buffer *s,char *buf,uint len)

{
  int iVar1;
  uint local_28;
  uint local_24;
  uint n;
  uint len_local;
  char *buf_local;
  buffer *s_local;
  
  local_28 = s->n;
  local_24 = len;
  _n = buf;
  if (local_28 - s->p < len) {
    iVar1 = buffer_flush(s);
    if (iVar1 == -1) {
      return -1;
    }
    if (local_28 < 0x2000) {
      local_28 = 0x2000;
    }
    for (; s->n < local_24; local_24 = local_24 - local_28) {
      if (local_24 < local_28) {
        local_28 = local_24;
      }
      iVar1 = allwrite(s->op,s->fd,_n,local_28);
      if (iVar1 == -1) {
        return -1;
      }
      _n = _n + local_28;
    }
  }
  byte_copy(s->x + s->p,local_24,_n);
  s->p = local_24 + s->p;
  return 0;
}

Assistant:

int buffer_put(buffer *s,const char *buf,unsigned int len)
{
  unsigned int n;
 
  n = s->n;
  if (len > n - s->p) {
    if (buffer_flush(s) == -1) return -1;
    /* now s->p == 0 */
    if (n < BUFFER_OUTSIZE) n = BUFFER_OUTSIZE;
    while (len > s->n) {
      if (n > len) n = len;
      if (allwrite(s->op,s->fd,buf,n) == -1) return -1;
      buf += n;
      len -= n;
    }
  }
  /* now len <= s->n - s->p */
  byte_copy(s->x + s->p,len,buf);
  s->p += len;
  return 0;
}